

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

int64_t c_v64_dotp_su8(c_v64 a,c_v64 b)

{
  c_v64 b_local;
  c_v64 a_local;
  
  a_local.u8[7] = a.u8[7];
  b_local.u8[7] = b.u8[7];
  a_local.u8[6] = a.u8[6];
  b_local.u8[6] = b.u8[6];
  a_local.u8[5] = a.u8[5];
  b_local.u8[5] = b.u8[5];
  a_local.u8[4] = a.u8[4];
  b_local.u8[4] = b.u8[4];
  a_local.u8[3] = a.u8[3];
  b_local.u8[3] = b.u8[3];
  a_local.u8[2] = a.u8[2];
  b_local.u8[2] = b.u8[2];
  a_local.u8[1] = a.u8[1];
  b_local.u8[1] = b.u8[1];
  a_local.u8[0] = a.u8[0];
  b_local.u8[0] = b.u8[0];
  return (long)(int)((int)a_local.s8[7] * (uint)b_local.u8[7] +
                     (int)a_local.s8[6] * (uint)b_local.u8[6] +
                     (int)a_local.s8[5] * (uint)b_local.u8[5] +
                     (int)a_local.s8[4] * (uint)b_local.u8[4] +
                     (int)a_local.s8[3] * (uint)b_local.u8[3] +
                     (int)a_local.s8[2] * (uint)b_local.u8[2] +
                     (int)a_local.s8[1] * (uint)b_local.u8[1] +
                    (int)a_local.s8[0] * (uint)b_local.u8[0]);
}

Assistant:

SIMD_INLINE int64_t c_v64_dotp_su8(c_v64 a, c_v64 b) {
  return a.s8[7] * b.u8[7] + a.s8[6] * b.u8[6] + a.s8[5] * b.u8[5] +
         a.s8[4] * b.u8[4] + a.s8[3] * b.u8[3] + a.s8[2] * b.u8[2] +
         a.s8[1] * b.u8[1] + a.s8[0] * b.u8[0];
}